

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void EDCircles::choldc(double **a,int n,double **l)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *__s;
  double dVar3;
  double *p;
  double sum;
  int local_28;
  int k;
  int j;
  int i;
  double **l_local;
  int n_local;
  double **a_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(n + 1);
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar2);
  memset(__s,0,(long)(n + 1) << 3);
  for (k = 1; k <= n; k = k + 1) {
    for (local_28 = k; local_28 <= n; local_28 = local_28 + 1) {
      p = (double *)a[k][local_28];
      sum._4_4_ = k;
      while (sum._4_4_ = sum._4_4_ + -1, 0 < sum._4_4_) {
        p = (double *)(-a[k][sum._4_4_] * a[local_28][sum._4_4_] + (double)p);
      }
      if (k == local_28) {
        if (0.0 < (double)p) {
          dVar3 = sqrt((double)p);
          *(double *)((long)__s + (long)k * 8) = dVar3;
        }
      }
      else {
        a[local_28][k] = (double)p / *(double *)((long)__s + (long)k * 8);
      }
    }
  }
  for (k = 1; k <= n; k = k + 1) {
    for (local_28 = k; local_28 <= n; local_28 = local_28 + 1) {
      if (k == local_28) {
        l[k][k] = *(double *)((long)__s + (long)k * 8);
      }
      else {
        l[local_28][k] = a[local_28][k];
        l[k][local_28] = 0.0;
      }
    }
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void EDCircles::choldc(double ** a, int n, double ** l)
{
	int i, j, k;
	double sum;
	double *p = new double[n + 1];
	memset(p, 0, sizeof(double)*(n + 1));


	for (i = 1; i <= n; i++)
	{
		for (j = i; j <= n; j++)
		{
			for (sum = a[i][j], k = i - 1; k >= 1; k--) sum -= a[i][k] * a[j][k];
			if (i == j)
			{
				if (sum <= 0.0)
					// printf("\nA is not poitive definite!");
				{
				}
				else
					p[i] = sqrt(sum);
			}
			else
			{
				a[j][i] = sum / p[i];
			}
		}
	}
	for (i = 1; i <= n; i++) {
		for (j = i; j <= n; j++) {
			if (i == j)
				l[i][i] = p[i];
			else
			{
				l[j][i] = a[j][i];
				l[i][j] = 0.0;
			}
		} //end-for-inner
	} // end-for-outer

	delete[] p;
}